

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O0

TonkResult
tonk_connect(TonkSocket tonkSocket,TonkConnectionConfig config,char *hostname,uint16_t port,
            TonkConnection *connectionOut,TonkJson *errorJsonOut)

{
  TonkConnectionConfig config_00;
  TonkResult TVar1;
  ErrorResult *pEVar2;
  char *__src;
  undefined8 *in_RCX;
  short in_DX;
  long in_RSI;
  long in_RDI;
  char *in_R8;
  Result *in_stack_00000010;
  ApplicationSession *session;
  Result result;
  Result *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  ErrorType type;
  string *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  ErrorResult *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  string local_1d8 [72];
  ErrorResult *local_190;
  allocator local_181;
  string local_180 [32];
  undefined8 local_160;
  long local_158;
  ErrorResult *local_150;
  allocator local_131;
  string local_130 [8];
  TonkConnection *in_stack_fffffffffffffed8;
  uint16_t in_stack_fffffffffffffee6;
  char *in_stack_fffffffffffffee8;
  ApplicationSession *in_stack_fffffffffffffef0;
  Result local_108;
  char *local_100;
  short local_ea;
  long local_e0;
  Result *local_d8;
  undefined8 local_c0;
  undefined4 local_b4;
  string *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  _func_void_TonkAppContextPtr_TonkConnection_TonkResult_char_ptr *in_stack_ffffffffffffff90;
  
  type = (ErrorType)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_d8 = &local_108;
  local_108.Error = (ErrorResult *)0x0;
  local_100 = in_R8;
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RCX == (undefined8 *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"Null parameter",&local_131);
    local_a0 = &stack0xfffffffffffffef0;
    local_a8 = "tonk_connect";
    local_b0 = local_130;
    local_b4 = 0;
    local_c0 = 2;
    pEVar2 = (ErrorResult *)operator_new(0x38);
    tonk::ErrorResult::ErrorResult
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,type,
               (ErrorCodeT)in_stack_fffffffffffffd90);
    local_108.Error = pEVar2;
    tonk::Result::~Result(in_stack_fffffffffffffd90);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
  }
  else {
    *in_RCX = 0;
    local_ea = in_DX;
    local_e0 = in_RDI;
    ValidateTonkConnectionConfig
              ((TonkConnectionConfig *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0)
              );
    local_108.Error = local_150;
    local_150 = (ErrorResult *)0x0;
    tonk::Result::~Result(in_stack_fffffffffffffd90);
    if (local_108.Error == (ErrorResult *)0x0) {
      local_158 = local_e0;
      if (local_ea == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_180,"Port was not set",&local_181);
        pEVar2 = (ErrorResult *)operator_new(0x38);
        tonk::ErrorResult::ErrorResult
                  (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                   type,(ErrorCodeT)in_stack_fffffffffffffd90);
        local_160 = 0;
        local_108.Error = pEVar2;
        tonk::Result::~Result(in_stack_fffffffffffffd90);
        std::__cxx11::string::~string(local_180);
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
      }
      else {
        config_00.OnConnect =
             (_func_void_TonkAppContextPtr_TonkConnection *)in_stack_ffffffffffffff78;
        config_00.AppContextPtr = (TonkAppContextPtr)in_stack_ffffffffffffff70;
        config_00.OnData._0_4_ = in_stack_ffffffffffffff80;
        config_00.OnData._4_4_ = in_stack_ffffffffffffff84;
        config_00.OnTick =
             (_func_void_TonkAppContextPtr_TonkConnection_uint64_t *)in_stack_ffffffffffffff88;
        config_00.OnClose = in_stack_ffffffffffffff90;
        tonk::ApplicationSession::tonk_connect
                  (in_stack_fffffffffffffef0,config_00,in_stack_fffffffffffffee8,
                   in_stack_fffffffffffffee6,in_stack_fffffffffffffed8);
        local_108.Error = local_190;
        local_190 = (ErrorResult *)0x0;
        tonk::Result::~Result(in_stack_00000010);
        in_stack_fffffffffffffd90 = in_stack_00000010;
      }
    }
  }
  if (local_100 != (char *)0x0) {
    tonk::Result::ToJson_abi_cxx11_
              ((Result *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    __src = (char *)std::__cxx11::string::c_str();
    strncpy(local_100,__src,0x400);
    local_100[0x3ff] = '\0';
    std::__cxx11::string::~string(local_1d8);
  }
  TVar1 = TonkResultFromDetailedResult(&local_108);
  tonk::Result::~Result(in_stack_fffffffffffffd90);
  return TVar1;
}

Assistant:

TONK_EXPORT TonkResult tonk_connect(
    TonkSocket          tonkSocket, // Socket to connect from
    TonkConnectionConfig    config, // Configuration for the connection
    const char*           hostname, // Hostname of the remote host
    uint16_t                  port, // Port for the remote host
    TonkConnection*  connectionOut, // Set to connection on success, else 0
    TonkJson*         errorJsonOut  // Receives detailed error message on error
)
{
    SIAMESE_DEBUG_ASSERT(hostname != nullptr); // Invalid input

    Result result;

    if (!tonkSocket || !hostname || !connectionOut)
        result = Result("tonk_connect", "Null parameter");
    else
    {
        *connectionOut = nullptr;

        result = ValidateTonkConnectionConfig(&config);
        if (result.IsFail())
        {
            TONK_DEBUG_BREAK(); // Invalid input
        }
        else
        {
            ApplicationSession* session = reinterpret_cast<ApplicationSession*>(tonkSocket);

            if (port == 0)
                result = Result("tonk_connect", "Port was not set");
            else
            {
                result = session->tonk_connect(
                    config,
                    hostname,
                    port,
                    connectionOut);
            }
        }
    }

    // Write optional error json object
    if (errorJsonOut)
        SafeCopyCStr(
            errorJsonOut->JsonString,
            TONK_ERROR_JSON_MAX_BYTES,
            result.ToJson().c_str());
    return TonkResultFromDetailedResult(result);
}